

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tv_ctrlpt.c
# Opt level: O1

void TvCtrlPointHandleSubscribeUpdate(char *eventURL,char *sid,int timeout)

{
  TvDeviceNode *pTVar1;
  int iVar2;
  long lVar3;
  char *__dest;
  
  pthread_mutex_lock((pthread_mutex_t *)&DeviceListMutex);
  pTVar1 = GlobalDeviceList;
  do {
    if (pTVar1 == (TvDeviceNode *)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)&DeviceListMutex);
      return;
    }
    __dest = (pTVar1->device).TvService[0].SID;
    lVar3 = 0;
    do {
      iVar2 = strcmp(__dest + -0x200,eventURL);
      if (iVar2 == 0) {
        SampleUtil_Print("Received Tv %s Event Renewal for eventURL %s\n",
                         *(undefined8 *)((long)TvServiceName + lVar3),eventURL);
        strcpy(__dest,sid);
        break;
      }
      lVar3 = lVar3 + 8;
      __dest = __dest + 0x520;
    } while (lVar3 == 8);
    pTVar1 = pTVar1->next;
  } while( true );
}

Assistant:

void TvCtrlPointHandleSubscribeUpdate(
	const char *eventURL, const Upnp_SID sid, int timeout)
{
	struct TvDeviceNode *tmpdevnode;
	int service;
	(void)timeout;

	ithread_mutex_lock(&DeviceListMutex);

	tmpdevnode = GlobalDeviceList;
	while (tmpdevnode) {
		for (service = 0; service < TV_SERVICE_SERVCOUNT; service++) {
			if (strcmp(tmpdevnode->device.TvService[service]
					    .EventURL,
				    eventURL) == 0) {
				SampleUtil_Print("Received Tv %s Event Renewal "
						 "for eventURL %s\n",
					TvServiceName[service],
					eventURL);
				strcpy(tmpdevnode->device.TvService[service]
						.SID,
					sid);
				break;
			}
		}

		tmpdevnode = tmpdevnode->next;
	}

	ithread_mutex_unlock(&DeviceListMutex);

	return;
}